

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O3

JavascriptDate *
Js::JavascriptDate::NewInstanceAsConstructor
          (Arguments *args,ScriptContext *scriptContext,bool forceCurrentDate)

{
  ulong uVar1;
  ulong uVar2;
  code *pcVar3;
  ScriptContext *requestContext;
  bool bVar4;
  undefined4 *puVar5;
  JavascriptDate *pJVar6;
  JavascriptDate *pJVar7;
  Var pvVar8;
  JavascriptString *pParseString;
  uint64 uVar9;
  uint64 uVar10;
  uint uVar11;
  uint i;
  ulong uVar12;
  double dVar13;
  double local_88;
  double resTime;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  Arguments *local_50;
  ScriptContext *local_48;
  JavascriptDate *local_40;
  double local_38;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x6a,"(scriptContext)","scriptContext");
    if (!bVar4) goto LAB_00bb3bb5;
    *puVar5 = 0;
  }
  pJVar6 = JavascriptLibrary::CreateDate((scriptContext->super_ScriptContextBase).javascriptLibrary)
  ;
  if (!forceCurrentDate) {
    uVar11 = SUB84(args->Info,0) & 0xffffff;
    if (uVar11 == 2) {
      pvVar8 = Arguments::operator[](args,1);
      bVar4 = VarIs<Js::JavascriptDate>(pvVar8);
      pvVar8 = Arguments::operator[](args,1);
      if (bVar4) {
        pJVar7 = VarTo<Js::JavascriptDate>(pvVar8);
        local_38 = (pJVar7->m_date).m_tvUtc;
      }
      else {
        pvVar8 = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)0>(pvVar8,scriptContext);
        bVar4 = VarIs<Js::JavascriptString>(pvVar8);
        if (bVar4) {
          pParseString = VarTo<Js::JavascriptString>(pvVar8);
          local_38 = DateImplementation::UtcTimeFromStr(scriptContext,pParseString);
        }
        else {
          if (((ulong)pvVar8 & 0x1ffff00000000) == 0x1000000000000 ||
              ((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
            if (((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
              if ((ulong)pvVar8 >> 0x32 == 0) {
                local_38 = JavascriptConversion::ToNumber_Full(pvVar8,scriptContext);
              }
              else {
                local_38 = (double)((ulong)pvVar8 ^ 0xfffc000000000000);
              }
              goto LAB_00bb3ac9;
            }
          }
          else {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar5 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar4) goto LAB_00bb3bb5;
            *puVar5 = 0;
          }
          local_38 = (double)(int)pvVar8;
        }
      }
LAB_00bb3ac9:
      uVar9 = NumberUtilities::ToSpecial(local_38);
      bVar4 = NumberUtilities::IsNan(local_38);
      if (((bVar4) && (uVar10 = NumberUtilities::ToSpecial(local_38), uVar10 != 0xfff8000000000000))
         && (uVar10 = NumberUtilities::ToSpecial(local_38), uVar10 != 0x7ff8000000000000)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar4) {
LAB_00bb3bb5:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar5 = 0;
      }
      dVar13 = TimeClip((Var)(uVar9 ^ 0xfffc000000000000));
      goto LAB_00bb3b79;
    }
    if (uVar11 != 1) {
      local_48 = scriptContext;
      local_40 = pJVar6;
      if (((ulong)args->Info & 0xfffffe) != 0) {
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        uVar12 = 0;
        local_50 = args;
        do {
          uVar1 = uVar12 + 1;
          pvVar8 = Arguments::operator[](local_50,(int)uVar1);
          if (((ulong)pvVar8 & 0x1ffff00000000) == 0x1000000000000 ||
              ((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
            if (((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000) goto LAB_00bb3872;
            if (pvVar8 < (Var)0x4000000000000) {
              local_38 = JavascriptConversion::ToNumber_Full(pvVar8,local_48);
            }
            else {
              local_38 = (double)((ulong)pvVar8 ^ 0xfffc000000000000);
            }
          }
          else {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar5 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar4) goto LAB_00bb3bb5;
            *puVar5 = 0;
LAB_00bb3872:
            local_38 = (double)(int)pvVar8;
          }
          (&local_88)[uVar12] = local_38;
          bVar4 = NumberUtilities::IsNan(local_38);
          pJVar6 = local_40;
          dVar13 = local_38;
          if ((bVar4) ||
             (bVar4 = NumberUtilities::IsFinite(local_38), pJVar6 = local_40, dVar13 = local_38,
             !bVar4)) goto LAB_00bb3b79;
          args = local_50;
        } while ((uVar1 < 7) &&
                (uVar2 = uVar12 + 2, uVar12 = uVar1, uVar2 < (SUB84(local_50->Info,0) & 0xffffff)));
      }
      pJVar6 = local_40;
      requestContext = local_48;
      uVar12 = 0;
      do {
        if (uVar12 < (*(uint *)&args->Info & 0xffffff) - 1) {
          dVar13 = JavascriptConversion::ToInteger((&local_88)[uVar12]);
        }
        else {
          dVar13 = 1.0;
          if (uVar12 != 2) {
            dVar13 = 0.0;
          }
        }
        (&local_88)[uVar12] = dVar13;
        uVar12 = uVar12 + 1;
      } while (uVar12 != 7);
      dVar13 = DateUtilities::TvFromDate
                         ((double)(~-(ulong)(local_88 < 100.0) & (ulong)local_88 |
                                  (~-(ulong)(0.0 <= local_88) & (ulong)local_88 |
                                  (ulong)(local_88 + 1900.0) & -(ulong)(0.0 <= local_88)) &
                                  -(ulong)(local_88 < 100.0)),resTime,local_78 + -1.0,
                          local_60 * 1000.0 + local_70 * 3600000.0 + local_68 * 60000.0 + local_58);
      DateImplementation::SetTvLcl(&pJVar6->m_date,dVar13,requestContext);
      return pJVar6;
    }
  }
  local_88 = DateImplementation::NowFromHiResTimer(scriptContext);
  if (scriptContext->TTDShouldPerformReplayAction == true) {
    TTD::EventLog::ReplayDateTimeEvent(scriptContext->threadContext->TTDLog,&local_88);
    dVar13 = local_88;
  }
  else {
    dVar13 = local_88;
    if (scriptContext->TTDShouldPerformRecordAction == true) {
      local_38 = local_88;
      TTD::EventLog::RecordDateTimeEvent(scriptContext->threadContext->TTDLog,local_88);
      dVar13 = local_38;
    }
  }
LAB_00bb3b79:
  DateImplementation::SetTvUtc(&pJVar6->m_date,dVar13);
  return pJVar6;
}

Assistant:

JavascriptDate* JavascriptDate::NewInstanceAsConstructor(Js::Arguments args, ScriptContext* scriptContext, bool forceCurrentDate)
    {
        Assert(scriptContext);

        double timeValue = 0;
        JavascriptDate* pDate;

        pDate = scriptContext->GetLibrary()->CreateDate();


        //
        // [15.9.3.3]
        // No arguments passed. Return the current time
        //
        if (forceCurrentDate || args.Info.Count == 1)
        {
            double resTime = DateImplementation::NowFromHiResTimer(scriptContext);

#if ENABLE_TTD
            if(scriptContext->ShouldPerformReplayAction())
            {
                scriptContext->GetThreadContext()->TTDLog->ReplayDateTimeEvent(&resTime);
            }
            else if(scriptContext->ShouldPerformRecordAction())
            {
                scriptContext->GetThreadContext()->TTDLog->RecordDateTimeEvent(resTime);
            }
            else
            {
                ;
            }
#endif

            pDate->m_date.SetTvUtc(resTime);
            return pDate;
        }

        //
        // [15.9.3.2]
        // One argument given
        // If string parse it and use that timeValue
        // Else convert to Number and use that as timeValue
        //
        if (args.Info.Count == 2)
        {
            if (VarIs<JavascriptDate>(args[1]))
            {
                JavascriptDate* dateObject = VarTo<JavascriptDate>(args[1]);
                timeValue = ((dateObject)->m_date).m_tvUtc;
            }
            else
            {
                Var value = JavascriptConversion::ToPrimitive<Js::JavascriptHint::None>(args[1], scriptContext);
                if (VarIs<JavascriptString>(value))
                {
                    timeValue = ParseHelper(scriptContext, VarTo<JavascriptString>(value));
                }
                else
                {
                    timeValue = JavascriptConversion::ToNumber(value, scriptContext);
                }
            }
            
            timeValue = TimeClip(JavascriptNumber::New(timeValue, scriptContext));

            pDate->m_date.SetTvUtc(timeValue);
            return pDate;
        }

        //
        // [15.9.3.1]
        // Date called with two to seven arguments
        //

        const int parameterCount = 7;
        double values[parameterCount];

        for (uint i=1; i < args.Info.Count && i < parameterCount+1; i++)
        {
            double curr = JavascriptConversion::ToNumber(args[i], scriptContext);
            values[i-1] = curr;
            if (JavascriptNumber::IsNan(curr) || !NumberUtilities::IsFinite(curr))
            {
                pDate->m_date.SetTvUtc(curr);
                return pDate;
            }
        }

        for (uint i=0; i < parameterCount; i++)
        {
            if ( i >= args.Info.Count-1 )
            {
                values[i] = ( i == 2 );
                continue;
            }
            // MakeTime (ES5 15.9.1.11) && MakeDay (ES5 15.9.1.12) always
            // call ToInteger (which is same as JavascriptConversion::ToInteger) on arguments.
            // All are finite (not Inf or Nan) as we check them explicitly in the previous loop.
            // +-0 & +0 are same in this context.
#pragma prefast(suppress:6001, "value index i < args.Info.Count - 1 are initialized")
            values[i] = JavascriptConversion::ToInteger(values[i]);
        }

        // adjust the year
        if (values[0] < 100 && values[0] >= 0)
            values[0] += 1900;

        // Get the local time value.
        timeValue = DateImplementation::TvFromDate(values[0], values[1], values[2] - 1,
            values[3] * 3600000 + values[4] * 60000 + values[5] * 1000 + values[6]);

        // Set the time.
        pDate->m_date.SetTvLcl(timeValue, scriptContext);

        return pDate;
    }